

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  xmlDict *dict_00;
  xmlChar *pxVar1;
  bool bVar2;
  undefined4 uVar3;
  uint hashValue;
  uint uVar4;
  int iVar5;
  xmlDictEntry *__src;
  xmlChar *pxVar6;
  uint uVar7;
  xmlDictEntry *pxVar8;
  ulong uVar9;
  uint uVar10;
  xmlDictEntry *pxVar11;
  xmlDictEntry *pxVar12;
  int found;
  size_t len;
  size_t plen;
  int local_4c;
  uint local_48;
  undefined4 uStack_44;
  uint local_40;
  undefined4 uStack_3c;
  xmlDictEntry *local_38;
  
  local_4c = 0;
  if (name == (xmlChar *)0x0 || dict == (xmlDictPtr)0x0) {
    return (xmlDictEntry *)0x0;
  }
  if (prefix == (xmlChar *)0x0) {
    iVar5 = -1;
    if (-1 < maybeLen) {
      iVar5 = maybeLen;
    }
    hashValue = xmlDictHashName(dict->seed,name,(long)iVar5,(size_t *)&local_48);
    pxVar11 = (xmlDictEntry *)CONCAT44(uStack_44,local_48);
    if ((xmlDictEntry *)&DAT_40000000 <= pxVar11) {
      return (xmlDictEntry *)0x0;
    }
  }
  else {
    hashValue = xmlDictHashQName(dict->seed,prefix,name,(size_t *)&local_40,(size_t *)&local_48);
    uVar9 = CONCAT44(uStack_44,local_48);
    if (0x3fffffff < uVar9) {
      return (xmlDictEntry *)0x0;
    }
    if (0x3fffffff - uVar9 <= CONCAT44(uStack_3c,local_40)) {
      return (xmlDictEntry *)0x0;
    }
    pxVar11 = (xmlDictEntry *)(uVar9 + CONCAT44(uStack_3c,local_40) + 1);
  }
  if ((xmlDictEntry *)(dict->limit - 1) < pxVar11) {
    return (xmlDictEntry *)0x0;
  }
  if (dict->size == 0) {
    __src = (xmlDictEntry *)0x0;
  }
  else {
    __src = xmlDictFindEntry(dict,prefix,name,(int)pxVar11,hashValue,&local_4c);
  }
  if (local_4c != 0) {
    return __src;
  }
  dict_00 = dict->subdict;
  if ((dict_00 != (xmlDict *)0x0) && (dict_00->size != 0)) {
    local_38 = __src;
    if (prefix == (xmlChar *)0x0) {
      uVar4 = xmlDictHashName(dict_00->seed,name,CONCAT44(uStack_44,local_48),(size_t *)&local_48);
    }
    else {
      uVar4 = xmlDictHashQName(dict_00->seed,prefix,name,(size_t *)&local_40,(size_t *)&local_48);
    }
    pxVar11 = xmlDictFindEntry(dict_00,prefix,name,(int)pxVar11,uVar4,&local_4c);
    __src = local_38;
    if (local_4c != 0) {
      return pxVar11;
    }
  }
  if (update == 0) {
    return (xmlDictEntry *)0x0;
  }
  uVar9 = dict->size;
  if ((ulong)(dict->nbElems + 1) <= (uVar9 & 0xfffffffffffffff8) - (uVar9 >> 3)) goto LAB_0012aa36;
  if (uVar9 == 0) {
    uVar4 = 8;
LAB_0012aa14:
    iVar5 = xmlDictGrow(dict,uVar4);
    if (iVar5 == 0) {
      uVar7 = (int)dict->size - 1;
      uVar9 = (ulong)(uVar7 & hashValue);
      pxVar8 = dict->table;
      __src = pxVar8 + uVar9;
      uVar4 = pxVar8[uVar9].hashValue;
      bVar2 = true;
      if (uVar4 != 0) {
        uVar10 = 0;
        do {
          if (((int)uVar9 - uVar4 & uVar7) < uVar10) break;
          uVar10 = uVar10 + 1;
          uVar4 = (int)uVar9 + 1;
          uVar9 = (ulong)uVar4;
          __src = __src + 1;
          if ((uVar4 & uVar7) == 0) {
            __src = pxVar8;
          }
          uVar4 = __src->hashValue;
        } while (uVar4 != 0);
      }
    }
    else {
      bVar2 = false;
      pxVar11 = (xmlDictEntry *)0x0;
    }
  }
  else {
    if (uVar9 < 0x80000000) {
      uVar4 = (int)uVar9 * 2;
      goto LAB_0012aa14;
    }
    bVar2 = false;
    pxVar11 = (xmlDictEntry *)0x0;
  }
  if (!bVar2) {
    return pxVar11;
  }
LAB_0012aa36:
  if (prefix == (xmlChar *)0x0) {
    pxVar6 = xmlDictAddString(dict,name,local_48);
  }
  else {
    pxVar6 = xmlDictAddQString(dict,prefix,local_40,name,local_48);
  }
  if (pxVar6 == (xmlChar *)0x0) {
    return (xmlDictEntry *)0x0;
  }
  if (__src->hashValue != 0) {
    pxVar11 = dict->table;
    pxVar12 = pxVar11 + dict->size;
    pxVar8 = __src;
    do {
      pxVar8 = pxVar8 + 1;
      if (pxVar12 <= pxVar8) {
        pxVar8 = pxVar11;
      }
    } while (pxVar8->hashValue != 0);
    if (pxVar8 < __src) {
      memmove(pxVar11 + 1,pxVar11,(long)pxVar8 - (long)pxVar11);
      pxVar11 = dict->table;
      uVar3 = *(undefined4 *)&pxVar12[-1].field_0x4;
      pxVar1 = pxVar12[-1].name;
      pxVar8 = pxVar12 + -1;
      pxVar11->hashValue = pxVar12[-1].hashValue;
      *(undefined4 *)&pxVar11->field_0x4 = uVar3;
      pxVar11->name = pxVar1;
    }
    memmove(__src + 1,__src,(long)pxVar8 - (long)__src);
  }
  __src->hashValue = hashValue;
  __src->name = pxVar6;
  dict->nbElems = dict->nbElems + 1;
  return __src;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size > 0)
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
    if (found)
        return(entry);

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
        unsigned newSize, mask, displ, pos;

        if (dict->size == 0) {
            newSize = MIN_HASH_SIZE;
        } else {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        }
        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}